

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

void Dau_DsdTest555(void)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  word *pwVar5;
  abctime aVar6;
  abctime aVar7;
  char cVar8;
  abctime time;
  abctime time_00;
  abctime time_01;
  abctime time_02;
  abctime time_03;
  bool bVar9;
  char *in_stack_ffffffffffffebf8;
  ulong local_1400;
  char *local_13f8;
  undefined8 local_13e0;
  char pBuffer [2000];
  word Tru [2] [64];
  char pRes [2000];
  
  __stream = fopen("_npn/npn/dsd10.txt","rb");
  local_13e0 = Abc_Clock();
  local_1400 = 0;
  local_13f8 = (char *)0x0;
  do {
    do {
      pcVar3 = fgets(pBuffer,2000,__stream);
      if (pcVar3 == (char *)0x0) {
        printf("Finished trying %d decompositions.  ",local_1400);
        Abc_PrintTime(0x77b9b0,local_13f8,time);
        aVar6 = Abc_Clock();
        Abc_PrintTime(0x713aba,(char *)(aVar6 - local_13e0),time_00);
        Abc_PrintTime(0x71598c,s_Times_0,time_01);
        Abc_PrintTime(0x7b7906,s_Times_1,time_02);
        Abc_PrintTime(0x715992,s_Times_2,time_03);
        fclose(__stream);
        return;
      }
      sVar4 = strlen(pBuffer);
      cVar8 = pBuffer[sVar4 - 1];
      if (cVar8 == '\n') {
        lVar1 = (long)&local_13e0 + 6;
        pBuffer[sVar4 - 1] = '\0';
        cVar8 = pBuffer[sVar4 - 2];
      }
      else {
        lVar1 = (long)&local_13e0 + 7;
      }
      if (cVar8 == '\r') {
        *(undefined1 *)(lVar1 + sVar4) = 0;
      }
    } while ((pBuffer[0] == '\0') || (pBuffer[0] == 'V'));
    local_1400 = (ulong)((int)local_1400 + 1);
    bVar9 = true;
    while (bVar9) {
      pwVar5 = Dau_DsdToTruth(pBuffer + (pBuffer[0] == '*'),10);
      Abc_TtCopy(Tru[0],pwVar5,0x10,0);
      Abc_TtCopy(Tru[1],pwVar5,0x10,0);
      aVar6 = Abc_Clock();
      iVar2 = Dau_DsdDecompose(Tru[1],10,0,1,pRes);
      aVar7 = Abc_Clock();
      Dau_DsdNormalize(in_stack_ffffffffffffebf8);
      if (iVar2 != 0) {
        __assert_fail("nSizeNonDec == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x814,"void Dau_DsdTest555()");
      }
      local_13f8 = local_13f8 + (aVar7 - aVar6);
      pwVar5 = Dau_DsdToTruth(pRes,10);
      iVar2 = Abc_TtEqual(pwVar5,Tru[0],0x10);
      bVar9 = false;
      if (iVar2 == 0) {
        bVar9 = false;
        printf("%s -> %s \n",pBuffer,pRes);
        puts("Verification failed.");
      }
    }
  } while( true );
}

Assistant:

void Dau_DsdTest555()
{
    int nVars = 10;
    int nWords = Abc_TtWordNum(nVars);
    char * pFileName = "_npn/npn/dsd10.txt";
    FILE * pFile = fopen( pFileName, "rb" );
    word Tru[2][DAU_MAX_WORD], * pTruth;
    char pBuffer[DAU_MAX_STR];
    char pRes[DAU_MAX_STR];
    int nSizeNonDec;
    int i, Counter = 0;
    abctime clk = Abc_Clock(), clkDec = 0, clk2;
//    return;

    while ( fgets( pBuffer, DAU_MAX_STR, pFile ) != NULL )
    {
        char * pStr2 = pBuffer + strlen(pBuffer)-1;
        if ( *pStr2 == '\n' )
            *pStr2-- = 0;
        if ( *pStr2 == '\r' )
            *pStr2-- = 0;
        if ( pBuffer[0] == 'V' || pBuffer[0] == 0 )
            continue;
        Counter++; 

        for ( i = 0; i < 1; i++ )
        {
//            Dau_DsdPermute( pBuffer );
            pTruth = Dau_DsdToTruth( pBuffer[0] == '*' ? pBuffer + 1 : pBuffer, nVars );
            Abc_TtCopy( Tru[0], pTruth, nWords, 0 );
            Abc_TtCopy( Tru[1], pTruth, nWords, 0 );
            clk2 = Abc_Clock();
            nSizeNonDec = Dau_DsdDecompose( Tru[1], nVars, 0, 1, pRes );
            clkDec += Abc_Clock() - clk2;
            Dau_DsdNormalize( pRes );
//            pStr2 = Dau_DsdPerform( t ); nSizeNonDec = 0;
            assert( nSizeNonDec == 0 );
            pTruth = Dau_DsdToTruth( pRes, nVars );
            if ( !Abc_TtEqual( pTruth, Tru[0], nWords ) )
            {
    //        Kit_DsdPrintFromTruth( (unsigned *)&t, 6 );
    //        printf( "  " );
    //        Kit_DsdPrintFromTruth( (unsigned *)&t2, 6 );
                printf( "%s -> %s \n", pBuffer, pRes );
                printf( "Verification failed.\n" );
            }
        }
    }
    printf( "Finished trying %d decompositions.  ", Counter );
    Abc_PrintTime( 1, "Time", clkDec );
    Abc_PrintTime( 1, "Total", Abc_Clock() - clk );

    Abc_PrintTime( 1, "Time1", s_Times[0] );
    Abc_PrintTime( 1, "Time2", s_Times[1] );
    Abc_PrintTime( 1, "Time3", s_Times[2] );

    fclose( pFile );
}